

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O0

weekday absl::lts_20250127::time_internal::cctz::detail::get_weekday(civil_second *cs)

{
  int iVar1;
  int iVar2;
  year_t yVar3;
  long lVar4;
  year_t wd;
  int k_weekday_offsets [13];
  undefined1 local_48 [8];
  weekday k_weekday_by_mon_off [13];
  civil_second *cs_local;
  
  unique0x1000015a = cs;
  memcpy(local_48,&DAT_0084fb50,0x34);
  memcpy(&wd,&DAT_0084fb90,0x34);
  yVar3 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::year
                    (stack0xfffffffffffffff0);
  iVar1 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::month
                    (stack0xfffffffffffffff0);
  lVar4 = (yVar3 % 400 + 0x960) - (ulong)(iVar1 < 3);
  iVar1 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::month
                    (stack0xfffffffffffffff0);
  iVar1 = k_weekday_offsets[(long)iVar1 + -2];
  iVar2 = civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::day
                    (stack0xfffffffffffffff0);
  return k_weekday_by_mon_off
         [((long)(iVar1 + iVar2) + (lVar4 / 4 - lVar4 / 100) + lVar4 / 400 + lVar4) % 7 + 4];
}

Assistant:

CONSTEXPR_F weekday get_weekday(const civil_second& cs) noexcept {
  CONSTEXPR_D weekday k_weekday_by_mon_off[13] = {
      weekday::monday,    weekday::tuesday,  weekday::wednesday,
      weekday::thursday,  weekday::friday,   weekday::saturday,
      weekday::sunday,    weekday::monday,   weekday::tuesday,
      weekday::wednesday, weekday::thursday, weekday::friday,
      weekday::saturday,
  };
  CONSTEXPR_D int k_weekday_offsets[1 + 12] = {
      -1, 0, 3, 2, 5, 0, 3, 5, 1, 4, 6, 2, 4,
  };
  year_t wd = 2400 + (cs.year() % 400) - (cs.month() < 3);
  wd += wd / 4 - wd / 100 + wd / 400;
  wd += k_weekday_offsets[cs.month()] + cs.day();
  return k_weekday_by_mon_off[wd % 7 + 6];
}